

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O2

int dedma(state *s,FILE *f,_Bool dry_run)

{
  int iVar1;
  undefined3 uVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t _a;
  uint uVar5;
  code *pcVar6;
  ent *peVar7;
  ent *peVar8;
  ent *peVar9;
  uint uVar10;
  uint uVar11;
  undefined7 in_register_00000011;
  int i;
  
  s->f = f;
  if ((int)CONCAT71(in_register_00000011,dry_run) == 0) {
    pcVar6 = printf;
  }
  else {
    pcVar6 = dont_printf;
  }
  (s->op).print = pcVar6;
  i = 0;
  peVar8 = (ent *)0x0;
  do {
    peVar7 = get_ent(s,i);
    if (peVar7 == (ent *)0x0) {
      flush_cache(s);
      return 0;
    }
    if (peVar8 != (ent *)0x0) {
      uVar10 = peVar7->addr;
      if ((uVar10 < (s->filter).addr0) || ((s->filter).addr1 <= uVar10)) {
        peVar7->out_of_band = true;
      }
      else {
        uVar11 = uVar10 - peVar8->addr;
        uVar5 = -uVar11;
        if (0 < (int)uVar11) {
          uVar5 = uVar11;
        }
        if ((uVar5 < 0x4001) || (peVar8->out_of_band != false)) {
          if (uVar10 < peVar8->addr + 4) {
            iVar4 = i;
            do {
              iVar1 = iVar4;
              if (iVar1 <= i + -0x3fff) goto LAB_001026b0;
              peVar8 = get_ent(s,iVar1 + -1);
              if (peVar8 == (ent *)0x0) goto LAB_001026b0;
              uVar10 = peVar7->addr;
              uVar5 = peVar8->addr;
              if (uVar10 == uVar5) {
                uVar2 = *(undefined3 *)&peVar7->field_0x9;
                peVar8->out_of_band = peVar7->out_of_band;
                *(undefined3 *)&peVar8->field_0x9 = uVar2;
                uVar3 = peVar7->val;
                peVar8->addr = peVar7->addr;
                peVar8->val = uVar3;
LAB_0010274d:
                drop_ent(s,i);
                i = i + -1;
                goto LAB_001026b0;
              }
              if (uVar10 == uVar5 + 3) {
                uVar10 = peVar7->val << 0x18;
LAB_0010274a:
                peVar8->val = peVar8->val | uVar10;
                goto LAB_0010274d;
              }
              if (uVar10 == uVar5 + 2) {
                uVar10 = peVar7->val << 0x10;
                goto LAB_0010274a;
              }
              if (uVar10 == uVar5 + 1) {
                uVar10 = peVar7->val << 8;
                goto LAB_0010274a;
              }
              iVar4 = iVar1 + -1;
            } while (uVar10 <= uVar5);
            rotate_ent(s,iVar1,i);
          }
        }
        else {
          iVar4 = i;
          do {
            iVar1 = iVar4;
            if (i + 7 <= iVar1) goto LAB_001026b0;
            peVar8 = get_ent(s,iVar1 + 1);
            if (peVar8 == (ent *)0x0) goto LAB_001026b0;
            uVar5 = peVar7->addr - peVar8->addr;
            uVar10 = -uVar5;
            if (0 < (int)uVar5) {
              uVar10 = uVar5;
            }
            iVar4 = iVar1 + 1;
          } while (uVar10 < 0x4001);
          for (; i <= iVar1; i = i + 1) {
            peVar9 = get_ent(s,i);
            peVar9->out_of_band = true;
          }
          uVar10 = peVar7->addr;
          if (uVar10 < peVar8->addr) {
            uVar5 = (s->filter).addr0;
            uVar11 = uVar10 + 4;
            if (uVar10 + 4 <= uVar5) {
              uVar11 = uVar5;
            }
            (s->filter).addr0 = uVar11;
          }
          else if (peVar8->addr < uVar10) {
            uVar5 = (s->filter).addr1;
            if (uVar10 < uVar5) {
              uVar5 = uVar10;
            }
            (s->filter).addr1 = uVar5;
          }
        }
      }
    }
LAB_001026b0:
    i = i + 1;
    peVar8 = peVar7;
  } while( true );
}

Assistant:

int
dedma(struct state *s, FILE *f, bool dry_run)
{
	struct filter *flt = &s->filter;
	struct ent *e0 = NULL, *e1;
	int i, j; /* dump line numbers */

	s->f = f;
	s->op.print = (dry_run ? dont_printf : printf);

	for (i = 0; e1 = e0, e0 = get_ent(s, i); i++) {
		if (!e1)
			continue;

		if (e0->addr < flt->addr0 || e0->addr >= flt->addr1) {
			/* out of band data */
			e0->out_of_band = true;

		} else if (abs(e0->addr - e1->addr) > MAX_DELTA &&
			   !e1->out_of_band) {
			/* wrap around or out of band data not caught by
			 * the address window */

			for (j = i + 1; (j < i + MAX_OUT_OF_BAND &&
					 (e1 = get_ent(s, j))); j++) {
				if (abs(e0->addr - e1->addr) > MAX_DELTA) {
					for (; i < j; i++)
						get_ent(s, i)->out_of_band = true;

					/* shrink the address window */
					if (e1->addr > e0->addr)
						flt->addr0 = max(e0->addr + 4,
								 flt->addr0);
					else if (e1->addr < e0->addr)
						flt->addr1 = min(e0->addr,
								 flt->addr1);
					break;
				}
			}

		} else if (e0->addr < e1->addr + 4) {
			/* badly ordered write, find a place for it */

			for (j = i - 1; (j > i - MAX_DELTA &&
					 (e1 = get_ent(s, j))); j--) {
				if (e0->addr == e1->addr) {
					/* duplicated write, keep the
					 * most recent one */
					*e1 = *e0;
					drop_ent(s, i--);
					break;

				} else if (e0->addr == e1->addr + 3) {
					/* 8bit writes */
					e1->val |= e0->val << 24;
					drop_ent(s, i--);
					break;

				} else if (e0->addr == e1->addr + 2) {
					/* 16bit writes */
					e1->val |= e0->val << 16;
					drop_ent(s, i--);
					break;

				} else if (e0->addr == e1->addr + 1) {
					/* 8bit writes */
					e1->val |= e0->val << 8;
					drop_ent(s, i--);
					break;

				} else if (e0->addr > e1->addr) {
					/* unordered write */
					rotate_ent(s, j + 1, i);
					break;
				}
			}
		}
	}

	flush_cache(s);
	return 0;
}